

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizepolicy.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QSizePolicy *p)

{
  QTextStream *this;
  undefined8 uVar1;
  QDebug this_00;
  uint *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QDebugStateSaver saver;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  undefined1 *local_50;
  QDebug local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)p);
  this = *(QTextStream **)p;
  this[0x30] = (QTextStream)0x0;
  QVar2.m_data = (storage_type *)0x1f;
  QVar2.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar2);
  QTextStream::operator<<(this,(QString *)local_48);
  if ((QArrayData *)local_48[0].stream != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_48[0].stream = *(int *)local_48[0].stream + -1;
    UNLOCK();
    if (*(int *)local_48[0].stream == 0) {
      QArrayData::deallocate((QArrayData *)local_48[0].stream,2,0x10);
    }
  }
  if ((*(QTextStream **)p)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)p,' ');
  }
  local_68.stream = *(Stream **)p;
  *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
  qt_QMetaEnum_debugOperator
            (&local_60,(longlong)&local_68,
             (QMetaObject *)(ulong)(*(ushort *)((long)in_RDX + 2) & 0xf),
             (char *)&QSizePolicy::staticMetaObject);
  this_00.stream = local_60.stream;
  QVar3.m_data = (storage_type *)0x13;
  QVar3.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_48);
  if ((QArrayData *)local_48[0].stream != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_48[0].stream = *(int *)local_48[0].stream + -1;
    UNLOCK();
    if (*(int *)local_48[0].stream == 0) {
      QArrayData::deallocate((QArrayData *)local_48[0].stream,2,0x10);
    }
  }
  if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_60.stream,' ');
  }
  local_58.stream = local_60.stream;
  *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
  qt_QMetaEnum_debugOperator
            (local_48,(longlong)&local_58,(QMetaObject *)(ulong)(*in_RDX >> 0x14 & 0xf),
             (char *)&QSizePolicy::staticMetaObject);
  QTextStream::operator<<((QTextStream *)local_48[0].stream,')');
  if ((char)(((QArrayData *)(local_48[0].stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
            _M_i == '\x01') {
    QTextStream::operator<<((QTextStream *)local_48[0].stream,' ');
  }
  QDebug::~QDebug(local_48);
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug(&local_60);
  QDebug::~QDebug(&local_68);
  uVar1 = *(undefined8 *)p;
  *(undefined8 *)p = 0;
  *(undefined8 *)dbg.stream = uVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QSizePolicy &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QSizePolicy(horizontalPolicy = " << p.horizontalPolicy()
                  << ", verticalPolicy = " << p.verticalPolicy() << ')';
    return dbg;
}